

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost89_get_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  uchar *__src;
  int iVar1;
  int iVar2;
  ossl_gost_cipher_ctx *c;
  GOST_CIPHER_PARAMS *a;
  void *__dest;
  uchar *p;
  
  c = (ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
  iVar1 = ASN1_TYPE_get((ASN1_TYPE *)params);
  if (iVar1 == 0x10) {
    p = ((params->value).asn1_string)->data;
    a = d2i_GOST_CIPHER_PARAMS
                  ((GOST_CIPHER_PARAMS **)0x0,&p,(long)((params->value).asn1_string)->length);
    iVar1 = a->iv->length;
    iVar2 = EVP_CIPHER_CTX_get_iv_length(ctx);
    if (iVar1 == iVar2) {
      iVar1 = OBJ_obj2nid((ASN1_OBJECT *)a->enc_param_set);
      if (iVar1 != 0) {
        iVar1 = gost_cipher_set_param(c,iVar1);
        if (iVar1 != 0) {
          __dest = (void *)EVP_CIPHER_CTX_original_iv(ctx);
          __src = a->iv->data;
          iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
          memcpy(__dest,__src,(long)iVar1);
          GOST_CIPHER_PARAMS_free(a);
          return 1;
        }
        GOST_CIPHER_PARAMS_free(a);
        return -1;
      }
      GOST_CIPHER_PARAMS_free(a);
      iVar2 = 0x6f;
      iVar1 = 0x5a2;
    }
    else {
      GOST_CIPHER_PARAMS_free(a);
      iVar2 = 0x71;
      iVar1 = 0x59a;
    }
    ERR_GOST_error(0x68,iVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                   ,iVar1);
  }
  return -1;
}

Assistant:

static int gost89_get_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    int len;
    GOST_CIPHER_PARAMS *gcp = NULL;
    unsigned char *p;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    int nid;

    if (ASN1_TYPE_get(params) != V_ASN1_SEQUENCE) {
        return -1;
    }

    p = params->value.sequence->data;

    gcp = d2i_GOST_CIPHER_PARAMS(NULL, (const unsigned char **)&p,
                                 params->value.sequence->length);

    len = gcp->iv->length;
    if (len != EVP_CIPHER_CTX_iv_length(ctx)) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_GET_ASN1_PARAMETERS, GOST_R_INVALID_IV_LENGTH);
        return -1;
    }

    nid = OBJ_obj2nid(gcp->enc_param_set);
    if (nid == NID_undef) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_GET_ASN1_PARAMETERS,
                GOST_R_INVALID_CIPHER_PARAM_OID);
        return -1;
    }

    if (!gost_cipher_set_param(c, nid)) {
        GOST_CIPHER_PARAMS_free(gcp);
        return -1;
    }
    /*XXX missing non-const accessor */
    memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), gcp->iv->data,
           EVP_CIPHER_CTX_iv_length(ctx));

    GOST_CIPHER_PARAMS_free(gcp);

    return 1;
}